

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  long lVar1;
  long lVar2;
  Fad<float> *in_RSI;
  TPZFMatrix<Fad<float>_> *in_RDI;
  int64_t i;
  Fad<float> *dst;
  int64_t size;
  long local_28;
  
  lVar1 = (in_RDI->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  lVar2 = (in_RDI->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  for (local_28 = 0; local_28 < lVar1 * lVar2; local_28 = local_28 + 1) {
    Fad<float>::operator=((Fad<float> *)in_RDI,in_RSI);
  }
  (in_RDI->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar>& TPZFMatrix<TVar>::operator=(const TVar value ) {
    int64_t size = ((int64_t)this->fRow) * this->fCol;
    TVar * dst   = fElem;
    for ( int64_t i = 0; i < size; i++ )
        *dst++ = value;
    this->fDecomposed = 0;
    return *this;
}